

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  Btree *p;
  BtShared *pBt_00;
  BtShared *pBt;
  int i;
  Btree *pBtree;
  BtCursor *pCur_local;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBt_00 = pCur->pBt;
    sqlite3BtreeEnter(p);
    sqlite3BtreeClearCursor(pCur);
    if (pCur->pPrev == (BtCursor *)0x0) {
      pBt_00->pCursor = pCur->pNext;
    }
    else {
      pCur->pPrev->pNext = pCur->pNext;
    }
    if (pCur->pNext != (BtCursor *)0x0) {
      pCur->pNext->pPrev = pCur->pPrev;
    }
    for (pBt._4_4_ = 0; pBt._4_4_ <= pCur->iPage; pBt._4_4_ = pBt._4_4_ + 1) {
      releasePage(pCur->apPage[pBt._4_4_]);
    }
    unlockBtreeIfUnused(pBt_00);
    invalidateOverflowCache(pCur);
    sqlite3BtreeLeave(p);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    int i;
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    sqlite3BtreeClearCursor(pCur);
    if( pCur->pPrev ){
      pCur->pPrev->pNext = pCur->pNext;
    }else{
      pBt->pCursor = pCur->pNext;
    }
    if( pCur->pNext ){
      pCur->pNext->pPrev = pCur->pPrev;
    }
    for(i=0; i<=pCur->iPage; i++){
      releasePage(pCur->apPage[i]);
    }
    unlockBtreeIfUnused(pBt);
    invalidateOverflowCache(pCur);
    /* sqlite3_free(pCur); */
    sqlite3BtreeLeave(pBtree);
  }
  return SQLITE_OK;
}